

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O2

int main(void)

{
  time_t tVar1;
  istream *piVar2;
  int *arr_00;
  ulong uVar3;
  int i;
  long lVar4;
  size_type __new_size;
  int *piVar5;
  initializer_list<int> __l;
  allocator_type local_6d;
  int n;
  vector<int,_std::allocator<int>_> arr2;
  int c;
  int b;
  int a;
  int local_38;
  int local_34;
  int local_30;
  int arr [3];
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  std::istream::operator>>((istream *)&std::cin,&n);
  __new_size = (size_type)n;
  if (__new_size == 3) {
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&a);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&b);
    std::istream::operator>>(piVar2,&c);
    Bozo_sort(&a,&b,&c,ABC);
    arr[0] = a;
    arr[1] = b;
    arr[2] = c;
    Bozo_sort(arr,3,DESC);
    local_38 = a;
    local_34 = b;
    local_30 = c;
    __l._M_len = 3;
    __l._M_array = &local_38;
    std::vector<int,_std::allocator<int>_>::vector(&arr2,__l,&local_6d);
    Bozo_sort(&arr2,DESC);
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if (-1 < n) {
      uVar3 = __new_size * 4;
    }
    arr_00 = (int *)operator_new__(uVar3);
    arr2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    arr2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    arr2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize(&arr2,__new_size);
    piVar5 = arr_00;
    for (lVar4 = 0; lVar4 < n; lVar4 = lVar4 + 1) {
      std::istream::operator>>((istream *)&std::cin,piVar5);
      arr2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar4] = *piVar5;
      piVar5 = piVar5 + 1;
    }
    Bozo_sort(arr_00,n,ABC);
    operator_delete__(arr_00);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&arr2.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main(){
    srand(time(NULL));
    int n;

    cin >> n;

    if (n == 3){
        int a,b,c;
        cin >> a >> b >> c;
        Bozo_sort(&a, &b, &c);
        int arr[] = {a,b,c};
        Bozo_sort(arr, 3, DESC);
        vector<int> arr2 ={a, b, c};
        Bozo_sort(arr2, DESC);
    } else {
        int *arr = new int[n];

        vector<int> arr2;
        arr2.resize(n);
        for (int i = 0; i < n; i++){
            cin >> arr[i];
            arr2[i] = arr[i];
        }

        Bozo_sort(arr, n);
//        Bozo_sort(arr2, DESC);


        delete[] arr;
    }
    return 0;
}